

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

void __thiscall duckdb::SingleFileBlockManager::LoadFreeList(SingleFileBlockManager *this)

{
  ulong uVar1;
  uint uVar2;
  MetadataManager *pMVar3;
  unsigned_long uVar4;
  mapped_type *pmVar5;
  bool bVar6;
  MetaBlockPointer pointer;
  long block;
  MetadataReader reader;
  
  uVar1 = this->free_list_id;
  if (uVar1 != 0xffffffffffffffff) {
    pMVar3 = BlockManager::GetMetadataManager(&this->super_BlockManager);
    pointer.offset = 0;
    pointer.unused_padding = 0;
    pointer.block_pointer = uVar1;
    MetadataReader::MetadataReader
              (&reader,pMVar3,pointer,
               (optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>)0x0,
               REGISTER_BLOCKS);
    uVar4 = ReadStream::Read<unsigned_long>(&reader.super_ReadStream);
    ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::clear
              (&(this->free_list)._M_t);
    while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, bVar6) {
      block = ReadStream::Read<long>(&reader.super_ReadStream);
      ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
      _M_insert_unique<long_const&>
                ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                 &this->free_list,&block);
      ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
      _M_insert_unique<long_const&>
                ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                 &this->newly_freed_list,&block);
    }
    uVar4 = ReadStream::Read<unsigned_long>(&reader.super_ReadStream);
    ::std::
    _Hashtable<long,_std::pair<const_long,_unsigned_int>,_std::allocator<std::pair<const_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->multi_use_blocks)._M_h);
    while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, bVar6) {
      block = ReadStream::Read<long>(&reader.super_ReadStream);
      uVar2 = ReadStream::Read<unsigned_int>(&reader.super_ReadStream);
      pmVar5 = ::std::__detail::
               _Map_base<long,_std::pair<const_long,_unsigned_int>,_std::allocator<std::pair<const_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<long,_std::pair<const_long,_unsigned_int>,_std::allocator<std::pair<const_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->multi_use_blocks,&block);
      *pmVar5 = uVar2;
    }
    pMVar3 = BlockManager::GetMetadataManager(&this->super_BlockManager);
    MetadataManager::Read(pMVar3,&reader.super_ReadStream);
    pMVar3 = BlockManager::GetMetadataManager(&this->super_BlockManager);
    MetadataManager::MarkBlocksAsModified(pMVar3);
    MetadataReader::~MetadataReader(&reader);
  }
  return;
}

Assistant:

void SingleFileBlockManager::LoadFreeList() {
	MetaBlockPointer free_pointer(free_list_id, 0);
	if (!free_pointer.IsValid()) {
		// no free list
		return;
	}
	MetadataReader reader(GetMetadataManager(), free_pointer, nullptr, BlockReaderType::REGISTER_BLOCKS);
	auto free_list_count = reader.Read<uint64_t>();
	free_list.clear();
	for (idx_t i = 0; i < free_list_count; i++) {
		auto block = reader.Read<block_id_t>();
		free_list.insert(block);
		newly_freed_list.insert(block);
	}
	auto multi_use_blocks_count = reader.Read<uint64_t>();
	multi_use_blocks.clear();
	for (idx_t i = 0; i < multi_use_blocks_count; i++) {
		auto block_id = reader.Read<block_id_t>();
		auto usage_count = reader.Read<uint32_t>();
		multi_use_blocks[block_id] = usage_count;
	}
	GetMetadataManager().Read(reader);
	GetMetadataManager().MarkBlocksAsModified();
}